

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

void __thiscall Vector::Vector(Vector *this,Type *on)

{
  ulong uVar1;
  string local_90 [32];
  undefined1 local_70 [56];
  string local_38 [32];
  Type *local_18;
  Type *on_local;
  Vector *this_local;
  
  *(undefined ***)this = &PTR__Vector_0011e898;
  local_18 = on;
  on_local = (Type *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"/std/vector",(allocator *)(local_70 + 0x37));
  Typelib::Type::getName_abi_cxx11_();
  fullName((Vector *)local_70,local_90);
  uVar1 = (**(code **)(*(long *)this + 0xc0))();
  Typelib::Container::Container(&this->super_Container,local_38,(string *)local_70,uVar1,local_18);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)(local_70 + 0x37));
  *(undefined ***)this = &PTR__Vector_0011e898;
  getElementLayout(&this->element_layout,local_18);
  return;
}

Assistant:

Vector::Vector(Type const& on)
    : Container("/std/vector", fullName(on.getName()), getNaturalSize(), on)
    , element_layout(getElementLayout(on))
{
}